

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlNormal3f(float x,float y,float z)

{
  uint uVar1;
  float normalx;
  float fVar2;
  float normaly;
  float fVar3;
  float normalz;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  
  fVar6 = x;
  fVar7 = y;
  if (RLGL.State.transformRequired) {
    fVar6 = z * RLGL.State.transform.m8 + x * RLGL.State.transform.m0 + y * RLGL.State.transform.m4;
    fVar7 = z * RLGL.State.transform.m9 + x * RLGL.State.transform.m1 + y * RLGL.State.transform.m5;
    z = z * RLGL.State.transform.m10 + x * RLGL.State.transform.m2 + y * RLGL.State.transform.m6;
  }
  fVar3 = SQRT(z * z + fVar6 * fVar6 + fVar7 * fVar7);
  uVar1 = -(uint)(fVar3 != 0.0) & 1;
  fVar2 = 1.0 / fVar3;
  RLGL.State.normalz = z * fVar2;
  if ((fVar3 == 0.0) && (!NAN(fVar3))) {
    RLGL.State.normalz = z;
  }
  uVar4 = (int)(uVar1 << 0x1f) >> 0x1f;
  uVar1 = (int)(uVar1 << 0x1f) >> 0x1f;
  uVar5 = CONCAT44(~uVar1 & (uint)fVar7,~uVar4 & (uint)fVar6) |
          CONCAT44((uint)(fVar2 * fVar7) & uVar1,(uint)(fVar2 * fVar6) & uVar4);
  RLGL.State.normalx = (float)(int)uVar5;
  RLGL.State.normaly = (float)(int)(uVar5 >> 0x20);
  return;
}

Assistant:

void rlNormal3f(float x, float y, float z)
{
    float normalx = x;
    float normaly = y;
    float normalz = z;
    if (RLGL.State.transformRequired)
    {
        normalx = RLGL.State.transform.m0*x + RLGL.State.transform.m4*y + RLGL.State.transform.m8*z;
        normaly = RLGL.State.transform.m1*x + RLGL.State.transform.m5*y + RLGL.State.transform.m9*z;
        normalz = RLGL.State.transform.m2*x + RLGL.State.transform.m6*y + RLGL.State.transform.m10*z;
    }
    float length = sqrtf(normalx*normalx + normaly*normaly + normalz*normalz);
    if (length != 0.0f)
    {
        float ilength = 1.0f/length;
        normalx *= ilength;
        normaly *= ilength;
        normalz *= ilength;
    }
    RLGL.State.normalx = normalx;
    RLGL.State.normaly = normaly;
    RLGL.State.normalz = normalz;
}